

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_77::AsyncPipe::abortRead(AsyncPipe *this)

{
  AsyncIoStream *pAVar1;
  PromiseFulfiller<void> *pPVar2;
  Own<kj::AsyncIoStream> local_38;
  Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead> local_20;
  
  pAVar1 = (this->state).ptr;
  if (pAVar1 != (AsyncIoStream *)0x0) {
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[5])();
    return;
  }
  local_38.ptr = (AsyncIoStream *)operator_new(0x10);
  ((local_38.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_00430a38
  ;
  ((local_38.ptr)->super_AsyncOutputStream)._vptr_AsyncOutputStream =
       (_func_int **)&PTR_write_00430ab8;
  local_20.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>::instance;
  local_38.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>::instance;
  local_20.ptr = (AbortedRead *)0x0;
  Own<kj::AsyncIoStream>::operator=(&this->ownState,&local_38);
  Own<kj::AsyncIoStream>::dispose(&local_38);
  Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>::~Own(&local_20);
  pPVar2 = (this->readAbortFulfiller).ptr.ptr;
  (this->state).ptr = (this->ownState).ptr;
  this->readAborted = true;
  if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
    (**pPVar2->_vptr_PromiseFulfiller)(pPVar2,&local_38);
    local_38.disposer = (Disposer *)0x0;
    local_38.ptr = (AsyncIoStream *)0x0;
    Own<kj::PromiseFulfiller<void>_>::operator=
              (&(this->readAbortFulfiller).ptr,(Own<kj::PromiseFulfiller<void>_> *)&local_38);
    Own<kj::PromiseFulfiller<void>_>::dispose((Own<kj::PromiseFulfiller<void>_> *)&local_38);
  }
  return;
}

Assistant:

void abortRead() override {
    KJ_IF_MAYBE(s, state) {
      s->abortRead();
    } else {
      ownState = kj::heap<AbortedRead>();
      state = *ownState;

      readAborted = true;
      KJ_IF_MAYBE(f, readAbortFulfiller) {
        f->get()->fulfill();
        readAbortFulfiller = nullptr;
      }
    }